

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::BuildTLAS(DeviceContextVkImpl *this,BuildTLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  undefined8 *puVar2;
  TopLevelASVkImpl *TLAS;
  BufferVkImpl *pBVar3;
  BufferVkImpl *pSrcPtr;
  TLASBuildInstanceData *pTVar4;
  BottomLevelASVkImpl *BLAS;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  VkGeometryInstanceFlagsKHR VVar11;
  VkBuildAccelerationStructureFlagsKHR VVar12;
  uint uVar13;
  VkDeviceAddress VVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined8 *puVar18;
  TLASInstanceDesc TVar19;
  string msg_1;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  VkAccelerationStructureBuildRangeInfoKHR *vkRangePtr;
  VkAccelerationStructureGeometryKHR vkASGeometry;
  VkAccelerationStructureBuildRangeInfoKHR vkRange;
  string local_148;
  undefined1 local_128 [20];
  VkBuildAccelerationStructureFlagsKHR VStack_114;
  uint uStack_110;
  undefined4 uStack_10c;
  VkAccelerationStructureKHR local_108;
  VkAccelerationStructureKHR pVStack_100;
  undefined8 local_f8;
  VkAccelerationStructureGeometryKHR *pVStack_f0;
  VkAccelerationStructureGeometryKHR **local_e8;
  VkDeviceOrHostAddressKHR VStack_e0;
  VkDeviceSize local_d8;
  BufferVkImpl *local_d0;
  BufferVkImpl *local_c8;
  DeviceContextVkImpl *local_c0;
  ulong local_b8;
  VkAccelerationStructureBuildRangeInfoKHR *local_b0;
  VkAccelerationStructureGeometryKHR local_a8;
  VkAccelerationStructureBuildRangeInfoKHR local_48;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildTLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  TLAS = (TopLevelASVkImpl *)Attribs->pTLAS;
  if (TLAS != (TopLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>((ITopLevelAS *)TLAS);
  }
  pBVar3 = (BufferVkImpl *)Attribs->pScratchBuffer;
  if (pBVar3 != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar3);
  }
  pSrcPtr = (BufferVkImpl *)Attribs->pInstanceBuffer;
  if (pSrcPtr != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pSrcPtr);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTLASState
            (this,TLAS,Attribs->TLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  TransitionOrVerifyBufferState
            (this,pBVar3,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  if (Attribs->Update == true) {
    bVar10 = TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
                       ((TopLevelASBase<Diligent::EngineVkImplTraits> *)TLAS,Attribs->pInstances,
                        Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                        Attribs->HitGroupStride,Attribs->BindingMode);
  }
  else {
    bVar10 = TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
                       ((TopLevelASBase<Diligent::EngineVkImplTraits> *)TLAS,Attribs->pInstances,
                        Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                        Attribs->HitGroupStride,Attribs->BindingMode);
  }
  if (bVar10 != false) {
    local_d8 = (ulong)Attribs->InstanceCount << 6;
    local_d0 = pSrcPtr;
    local_c8 = pBVar3;
    VulkanUploadHeap::Allocate
              ((VulkanUploadAllocation *)&local_a8,&this->m_UploadHeap,local_d8,0x10);
    if (Attribs->InstanceCount != 0) {
      lVar16 = 0x45;
      uVar15 = 0;
      local_c0 = this;
      do {
        pTVar4 = Attribs->pInstances;
        local_b8 = uVar15;
        TVar19 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                           ((TopLevelASBase<Diligent::EngineVkImplTraits> *)TLAS,
                            *(char **)((long)((pTVar4->Transform).data + -6) + 0xb + lVar16));
        uVar13 = Attribs->InstanceCount;
        if (TVar19.InstanceIndex < uVar13) {
          puVar18 = (undefined8 *)((TVar19._0_8_ >> 0x20) * 0x40 + (long)local_a8.pNext);
          BLAS = *(BottomLevelASVkImpl **)((long)((pTVar4->Transform).data + -5) + 3 + lVar16);
          if (BLAS != (BottomLevelASVkImpl *)0x0) {
            CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                      ((IBottomLevelAS *)BLAS);
          }
          puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -5) + 0xb + lVar16);
          uVar5 = *puVar2;
          uVar6 = puVar2[1];
          puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -4) + 0xb + lVar16);
          uVar7 = *puVar2;
          uVar8 = puVar2[1];
          puVar2 = (undefined8 *)((long)((pTVar4->Transform).data + -3) + 0xb + lVar16);
          uVar9 = puVar2[1];
          puVar18[4] = *puVar2;
          puVar18[5] = uVar9;
          puVar18[2] = uVar7;
          puVar18[3] = uVar8;
          *puVar18 = uVar5;
          puVar18[1] = uVar6;
          uVar15 = puVar18[6];
          uVar17 = (TVar19._0_8_ << 0x20 |
                   (ulong)*(uint *)((long)((pTVar4->Transform).data + -2) + 0xb + lVar16)) &
                   0xffffff00ffffff;
          puVar18[6] = uVar17 | uVar15 & 0xff000000ff000000;
          puVar18[6] = uVar17 | uVar15 & 0xff00000000000000 |
                       (ulong)*(byte *)((long)((pTVar4->Transform).data + -1) + lVar16) << 0x18;
          VVar11 = InstanceFlagsToVkGeometryInstanceFlags
                             (*(RAYTRACING_INSTANCE_FLAGS *)
                               ((long)((pTVar4->Transform).data + -2) + 0xf + lVar16));
          this = local_c0;
          *(char *)((long)puVar18 + 0x37) = (char)VVar11;
          puVar18[7] = BLAS->m_DeviceAddress;
          TransitionOrVerifyBLASState
                    (local_c0,BLAS,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                     "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
        }
        else {
          FormatString<char[32]>
                    ((string *)local_128,(char (*) [32])"Failed to find instance by name");
          DebugAssertionFailed
                    ((Char *)local_128._0_8_,"BuildTLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xe88);
          if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
            operator_delete((void *)local_128._0_8_,stack0xfffffffffffffee8 + 1);
          }
        }
        if (uVar13 <= TVar19.InstanceIndex) {
          return;
        }
        uVar15 = local_b8 + 1;
        lVar16 = lVar16 + 0x50;
      } while (uVar15 < Attribs->InstanceCount);
    }
    pBVar3 = local_d0;
    UpdateBufferRegion(this,local_d0,Attribs->InstanceBufferOffset,local_d8,(VkBuffer)local_a8._0_8_
                       ,local_a8.geometry._0_8_,Attribs->InstanceBufferTransitionMode);
    TransitionOrVerifyBufferState
              (this,pBVar3,Attribs->InstanceBufferTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
               VK_ACCESS_SHADER_READ_BIT,"Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
    local_e8 = (VkAccelerationStructureGeometryKHR **)0x0;
    VStack_e0.deviceAddress = 0;
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    pVStack_f0 = (VkAccelerationStructureGeometryKHR *)0x0;
    local_108 = (VkAccelerationStructureKHR)0x0;
    pVStack_100 = (VkAccelerationStructureKHR)0x0;
    stack0xfffffffffffffee8 = 0;
    _uStack_110 = 0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (void *)0x0;
    local_b0 = &local_48;
    local_48.firstVertex = 0;
    local_48.transformOffset = 0;
    local_a8.geometry.triangles.transformData = (VkDeviceOrHostAddressConstKHR)0x0;
    local_a8.geometry._40_8_ = 0;
    local_a8.geometry.triangles.indexData = (VkDeviceOrHostAddressConstKHR)0x0;
    local_a8.geometry.aabbs.stride = 0;
    local_a8.geometry.triangles.vertexStride = 0;
    local_48.primitiveOffset = 0;
    local_48.primitiveCount = Attribs->InstanceCount;
    local_a8._0_8_ = (VkBuffer)0x3b9d13f6;
    local_a8.pNext = (void *)0x0;
    local_a8._16_8_ = 2;
    local_a8._88_8_ = 0;
    local_a8.geometry._0_8_ = 0x3b9d13f4;
    local_a8.geometry.triangles.pNext = (void *)0x0;
    local_a8.geometry.aabbs.data = (VkDeviceOrHostAddressConstKHR)0x0;
    VVar14 = BufferVkImpl::GetVkDeviceAddress(pBVar3);
    pBVar3 = local_c8;
    local_a8.geometry.aabbs.stride = VVar14 + Attribs->InstanceBufferOffset;
    if ((local_a8.geometry.aabbs.stride & 0xf) != 0) {
      FormatString<char[46]>
                (&local_148,(char (*) [46])"Instance data address is not properly aligned");
      DebugAssertionFailed
                (local_148._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xeb2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    local_128._0_4_ = 0x3b9d13f0;
    stack0xfffffffffffffee8 = stack0xfffffffffffffee8 & 0xffffffff00000000;
    VVar12 = BuildASFlagsToVkBuildAccelerationStructureFlags
                       ((TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                        .m_Desc.Flags);
    VStack_114 = VVar12;
    uVar13 = CONCAT31(0,Attribs->Update);
    uStack_110 = uVar13;
    if (uVar13 == 1) {
      local_108 = (TLAS->m_VulkanTLAS).m_VkObject;
    }
    else {
      local_108 = (VkAccelerationStructureKHR_T *)0x0;
    }
    pVStack_f0 = &local_a8;
    pVStack_100 = (TLAS->m_VulkanTLAS).m_VkObject;
    local_f8._0_4_ = 1;
    local_e8 = (VkAccelerationStructureGeometryKHR **)0x0;
    VVar14 = BufferVkImpl::GetVkDeviceAddress(pBVar3);
    VStack_e0.hostAddress = (void *)(VVar14 + Attribs->ScratchBufferOffset);
    if (VStack_e0.deviceAddress %
        (ulong)*(uint32_t *)
                ((long)&(((((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                           m_pObject)->m_PhysicalDevice)._M_t.
                          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                         _M_head_impl)->m_ExtProperties).AccelStruct + 0x38) != 0) {
      FormatString<char[53]>
                (&local_148,(char (*) [53])"Scratch buffer start address is not properly aligned");
      DebugAssertionFailed
                (local_148._M_dataplus._M_p,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xec0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
              (&this->m_CommandBuffer,1,(VkAccelerationStructureBuildGeometryInfoKHR *)local_128,
               &local_b0);
    pUVar1 = &(this->m_State).NumCommands;
    *pUVar1 = *pUVar1 + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    TDeviceContextBase::BuildTLAS(Attribs, 0);

    static_assert(TLAS_INSTANCE_DATA_SIZE == sizeof(VkAccelerationStructureInstanceKHR), "Value in TLAS_INSTANCE_DATA_SIZE doesn't match the actual instance description size");

    TopLevelASVkImpl*     pTLASVk      = ClassPtrCast<TopLevelASVkImpl>(Attribs.pTLAS);
    BufferVkImpl*         pScratchVk   = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    BufferVkImpl*         pInstancesVk = ClassPtrCast<BufferVkImpl>(Attribs.pInstanceBuffer);
    const TopLevelASDesc& TLASDesc     = pTLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)";
    TransitionOrVerifyTLASState(*pTLASVk, Attribs.TLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    if (Attribs.Update)
    {
        if (!pTLASVk->UpdateInstances(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }
    else
    {
        if (!pTLASVk->SetInstanceData(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }

    // copy instance data into instance buffer
    {
        size_t                 Size     = Attribs.InstanceCount * sizeof(VkAccelerationStructureInstanceKHR);
        VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, 16);

        for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
        {
            const TLASBuildInstanceData& Inst     = Attribs.pInstances[i];
            const TLASInstanceDesc       InstDesc = pTLASVk->GetInstanceDesc(Inst.InstanceName);

            if (InstDesc.InstanceIndex >= Attribs.InstanceCount)
            {
                UNEXPECTED("Failed to find instance by name");
                return;
            }

            VkAccelerationStructureInstanceKHR& vkASInst = static_cast<VkAccelerationStructureInstanceKHR*>(TmpSpace.CPUAddress)[InstDesc.InstanceIndex];
            BottomLevelASVkImpl*                pBLASVk  = ClassPtrCast<BottomLevelASVkImpl>(Inst.pBLAS);

            static_assert(sizeof(vkASInst.transform) == sizeof(Inst.Transform), "size mismatch");
            std::memcpy(&vkASInst.transform, Inst.Transform.data, sizeof(vkASInst.transform));

            vkASInst.instanceCustomIndex                    = Inst.CustomId;
            vkASInst.instanceShaderBindingTableRecordOffset = InstDesc.ContributionToHitGroupIndex;
            vkASInst.mask                                   = Inst.Mask;
            vkASInst.flags                                  = InstanceFlagsToVkGeometryInstanceFlags(Inst.Flags);
            vkASInst.accelerationStructureReference         = pBLASVk->GetVkDeviceAddress();

            TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
        }

        UpdateBufferRegion(pInstancesVk, Attribs.InstanceBufferOffset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, Attribs.InstanceBufferTransitionMode);
    }
    TransitionOrVerifyBufferState(*pInstancesVk, Attribs.InstanceBufferTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR     vkASBuildInfo = {};
    VkAccelerationStructureBuildRangeInfoKHR        vkRange       = {};
    VkAccelerationStructureBuildRangeInfoKHR const* vkRangePtr    = &vkRange;
    VkAccelerationStructureGeometryKHR              vkASGeometry  = {};

    vkRange.primitiveCount = Attribs.InstanceCount;

    vkASGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
    vkASGeometry.pNext        = nullptr;
    vkASGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;
    vkASGeometry.flags        = 0;

    VkAccelerationStructureGeometryInstancesDataKHR& vkASInst{vkASGeometry.geometry.instances};
    vkASInst.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
    vkASInst.pNext              = nullptr;
    vkASInst.arrayOfPointers    = VK_FALSE;
    vkASInst.data.deviceAddress = pInstancesVk->GetVkDeviceAddress() + Attribs.InstanceBufferOffset;

    // if geometry.arrayOfPointers is VK_FALSE, geometry.instances.data.deviceAddress must be aligned to 16 bytes
    VERIFY(vkASInst.data.deviceAddress % 16 == 0, "Instance data address is not properly aligned");

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;                    // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(TLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pTLASVk->GetVkTLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pTLASVk->GetVkTLAS();
    vkASBuildInfo.geometryCount             = 1;
    vkASBuildInfo.pGeometries               = &vkASGeometry;
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &vkRangePtr);
    ++m_State.NumCommands;
}